

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

void __thiscall rengine::TestBase::onAfterRender(TestBase *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint *pixels_00;
  Renderer *pRVar4;
  char *filename;
  ostream *poVar5;
  undefined4 extraout_var;
  Backend *this_00;
  ulong uVar6;
  float fVar7;
  vec2 vVar8;
  allocator local_49;
  string local_48 [8];
  string file;
  bool ok;
  uint *pixels;
  vec2 size;
  TestBase *this_local;
  
  if (this->m_currentTest != (StaticRenderTest *)0x0) {
    vVar8 = Surface::size((Surface *)this);
    pixels._0_4_ = vVar8.x;
    pixels._4_4_ = vVar8.y;
    fVar7 = pixels._0_4_ * pixels._4_4_ * 4.0;
    uVar6 = (ulong)fVar7;
    pixels_00 = (uint *)malloc(uVar6 | (long)(fVar7 - 9.223372e+18) & (long)uVar6 >> 0x3f);
    pRVar4 = StandardSurface::renderer(&this->super_StandardSurface);
    uVar2 = (*pRVar4->_vptr_Renderer[5])
                      (pRVar4,0,0,(ulong)(uint)(int)pixels._0_4_,(ulong)(uint)(int)pixels._4_4_,
                       pixels_00);
    if (((uVar2 & 1) == 0) && ((uVar2 & 1) == 0)) {
      __assert_fail("ok",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/test.h"
                    ,0xc6,"virtual void rengine::TestBase::onAfterRender()");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"pixeldump_",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    (*this->m_currentTest->_vptr_StaticRenderTest[2])();
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::append((char *)local_48);
    filename = (char *)std::__cxx11::string::c_str();
    stbi_write_png(filename,(int)pixels._0_4_,(int)pixels._4_4_,4,pixels_00,
                   (int)(pixels._0_4_ * 4.0));
    StaticRenderTest::setPixels(this->m_currentTest,(int)pixels._0_4_,(int)pixels._4_4_,pixels_00);
    (*this->m_currentTest->_vptr_StaticRenderTest[1])();
    poVar5 = std::operator<<((ostream *)&std::cout,"tst_");
    iVar3 = (*this->m_currentTest->_vptr_StaticRenderTest[2])();
    poVar5 = std::operator<<(poVar5,(char *)CONCAT44(extraout_var,iVar3));
    poVar5 = std::operator<<(poVar5,": ok");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    bVar1 = std::__cxx11::
            list<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>::empty
                      (&this->tests);
    if (bVar1) {
      if ((this->leaveRunning & 1U) == 0) {
        this_00 = Backend::get();
        Backend::quit(this_00);
      }
    }
    else {
      Surface::requestRender((Surface *)this);
    }
    free(pixels_00);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void onAfterRender() override {
        if (!m_currentTest)
            return;

        vec2 size = Surface::size();
        unsigned *pixels = (unsigned *) malloc(size.x * size.y * sizeof(unsigned));

        bool ok = renderer()->readPixels(0, 0, size.x, size.y, (unsigned *) pixels);
        check_true(ok);

        // dump the image to disk..
        string file("pixeldump_");
        file.append(m_currentTest->name());
        file.append(".png");
        stbi_write_png(file.c_str(), size.x, size.y, 4, pixels, size.x * sizeof(unsigned));

        m_currentTest->setPixels(size.x, size.y, pixels);
        m_currentTest->check();
        cout << "tst_" << m_currentTest->name() << ": ok" << endl;

        if (tests.empty()) {
            if (!leaveRunning)
                Backend::get()->quit();
        } else {
            requestRender();
        }

        free(pixels);
    }